

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary.cpp
# Opt level: O2

bool __thiscall
CaDiCaL::Internal::hyper_ternary_resolve(Internal *this,Clause *c,int pivot,Clause *d)

{
  int64_t *piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  ulong uVar6;
  int *lit;
  Clause *pCVar7;
  long lVar8;
  
  piVar1 = &(this->stats).ternres;
  *piVar1 = *piVar1 + 1;
  pCVar7 = c + 1;
  this_00 = &this->clause;
  for (lVar8 = (long)c->size << 2; lVar8 != 0; lVar8 = lVar8 + -4) {
    if (*(int *)&pCVar7->field_0 != pivot) {
      std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict3 *)pCVar7);
    }
    pCVar7 = (Clause *)((long)&pCVar7->field_0 + 4);
  }
  pCVar7 = d + 1;
  for (lVar8 = (long)d->size << 2; lVar8 != 0; lVar8 = lVar8 + -4) {
    iVar2 = *(int *)&pCVar7->field_0;
    if (iVar2 != -pivot) {
      piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = *piVar4;
      if (iVar2 != iVar3) {
        if (iVar3 + iVar2 == 0) goto LAB_006917e1;
        iVar3 = piVar4[1];
        if (iVar2 != iVar3) {
          if (iVar2 + iVar3 == 0) goto LAB_006917e1;
          std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict3 *)pCVar7);
        }
      }
    }
    pCVar7 = (Clause *)((long)&pCVar7->field_0 + 4);
  }
  piVar4 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
  if (uVar6 < 4) {
    if (uVar6 == 3) {
      bVar5 = ternary_find_ternary_clause(this,*piVar4,piVar4[1],piVar4[2]);
LAB_006917dd:
      if (bVar5 != false) goto LAB_006917e1;
    }
    else if (uVar6 == 2) {
      bVar5 = ternary_find_binary_clause(this,*piVar4,piVar4[1]);
      goto LAB_006917dd;
    }
    bVar5 = true;
  }
  else {
LAB_006917e1:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Internal::hyper_ternary_resolve (Clause *c, int pivot, Clause *d) {
  LOG ("hyper binary resolving on pivot %d", pivot);
  LOG (c, "1st antecedent");
  LOG (d, "2nd antecedent");
  stats.ternres++;
  assert (c->size == 3);
  assert (d->size == 3);
  assert (clause.empty ());
  for (const auto &lit : *c)
    if (lit != pivot)
      clause.push_back (lit);
  for (const auto &lit : *d) {
    if (lit == -pivot)
      continue;
    if (lit == clause[0])
      continue;
    if (lit == -clause[0])
      return false;
    if (lit == clause[1])
      continue;
    if (lit == -clause[1])
      return false;
    clause.push_back (lit);
  }
  size_t size = clause.size ();
  if (size > 3)
    return false;
  if (size == 2 && ternary_find_binary_clause (clause[0], clause[1]))
    return false;
  if (size == 3 &&
      ternary_find_ternary_clause (clause[0], clause[1], clause[2]))
    return false;
  return true;
}